

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O3

QMenu * __thiscall QMainWindow::createPopupMenu(QMainWindow *this)

{
  long lVar1;
  QWidget *dockWidget;
  qsizetype qVar2;
  QWidget *this_00;
  QDockWidgetGroupWindow *this_01;
  QDockAreaLayoutInfo *this_02;
  QAction *pQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QList<QDockWidget_*> list;
  QList<int> local_90;
  QList<int> local_78;
  QArrayData *local_58;
  long lStack_50;
  ulong local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  this_00 = (QWidget *)0x0;
  qt_qFindChildren_helper(this,0,0,&QDockWidget::staticMetaObject,&local_58,1);
  if (local_48 != 0) {
    this_00 = (QWidget *)operator_new(0x28);
    QMenu::QMenu((QMenu *)this_00,&this->super_QWidget);
    if (local_48 != 0) {
      uVar4 = 0;
      do {
        dockWidget = *(QWidget **)(lStack_50 + uVar4 * 8);
        if (*(QMainWindow **)(*(long *)&dockWidget->field_0x8 + 0x10) == this) {
          QDockAreaLayout::indexOf
                    (&local_78,(QDockAreaLayout *)(*(long *)(lVar1 + 0x260) + 0x1a0),dockWidget);
LAB_0042a95c:
          qVar2 = local_78.d.size;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
            }
          }
          if (qVar2 != 0) {
            pQVar3 = QDockWidget::toggleViewAction(*(QDockWidget **)(lStack_50 + uVar4 * 8));
            QWidget::addAction(this_00,pQVar3);
          }
        }
        else {
          this_01 = (QDockWidgetGroupWindow *)
                    QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
          if ((this_01 != (QDockWidgetGroupWindow *)0x0) &&
             (*(QMainWindow **)(*(long *)(this_01 + 8) + 0x10) == this)) {
            this_02 = QDockWidgetGroupWindow::layoutInfo(this_01);
            QDockAreaLayoutInfo::indexOf(&local_78,this_02,dockWidget);
            goto LAB_0042a95c;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_48);
    }
    QMenu::addSeparator((QMenu *)this_00);
  }
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (int *)0x0;
  local_78.d.size = 0;
  qt_qFindChildren_helper(this,0,0,&QToolBar::staticMetaObject,&local_78,1);
  if (local_78.d.size != 0) {
    if (this_00 == (QWidget *)0x0) {
      this_00 = (QWidget *)operator_new(0x28);
      QMenu::QMenu((QMenu *)this_00,&this->super_QWidget);
      if (local_78.d.size == 0) goto LAB_0042aaac;
    }
    uVar4 = 0;
    do {
      if (*(QMainWindow **)(*(long *)&(*(QWidget **)(local_78.d.ptr + uVar4 * 2))->field_0x8 + 0x10)
          == this) {
        QToolBarAreaLayout::indexOf
                  (&local_90,(QToolBarAreaLayout *)(*(long *)(lVar1 + 0x260) + 0xa0),
                   *(QWidget **)(local_78.d.ptr + uVar4 * 2));
        qVar2 = local_90.d.size;
        if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,4,0x10);
          }
        }
        if (qVar2 != 0) {
          pQVar3 = QToolBar::toggleViewAction(*(QToolBar **)(local_78.d.ptr + uVar4 * 2));
          QWidget::addAction(this_00,pQVar3);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)local_78.d.size);
  }
LAB_0042aaac:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QMainWindow::createPopupMenu()
{
    Q_D(QMainWindow);
    QMenu *menu = nullptr;
#if QT_CONFIG(dockwidget)
    QList<QDockWidget *> dockwidgets = findChildren<QDockWidget *>();
    if (dockwidgets.size()) {
        menu = new QMenu(this);
        for (int i = 0; i < dockwidgets.size(); ++i) {
            QDockWidget *dockWidget = dockwidgets.at(i);
            // filter to find out if we own this QDockWidget
            if (dockWidget->parentWidget() == this) {
                if (d->layout->layoutState.dockAreaLayout.indexOf(dockWidget).isEmpty())
                    continue;
            } else if (QDockWidgetGroupWindow *dwgw =
                           qobject_cast<QDockWidgetGroupWindow *>(dockWidget->parentWidget())) {
                if (dwgw->parentWidget() != this)
                    continue;
                if (dwgw->layoutInfo()->indexOf(dockWidget).isEmpty())
                    continue;
            } else {
                continue;
            }
            menu->addAction(dockwidgets.at(i)->toggleViewAction());
        }
        menu->addSeparator();
    }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
    QList<QToolBar *> toolbars = findChildren<QToolBar *>();
    if (toolbars.size()) {
        if (!menu)
            menu = new QMenu(this);
        for (int i = 0; i < toolbars.size(); ++i) {
            QToolBar *toolBar = toolbars.at(i);
            if (toolBar->parentWidget() == this
                && (!d->layout->layoutState.toolBarAreaLayout.indexOf(toolBar).isEmpty())) {
                menu->addAction(toolbars.at(i)->toggleViewAction());
            }
        }
    }
#endif
    Q_UNUSED(d);
    return menu;
}